

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::Environment::bind<tcu::Vector<int,2>>
          (Environment *this,Variable<tcu::Vector<int,_2>_> *variable,IVal *value)

{
  deInt32 *pdVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uchar *puVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  _func_int **pp_Var21;
  mapped_type local_50;
  key_type local_40;
  
  pp_Var21 = (_func_int **)operator_new__(0x30);
  uVar13 = value->m_data[0].field_0x4;
  uVar14 = value->m_data[0].field_0x5;
  uVar15 = value->m_data[0].field_0x6;
  uVar16 = value->m_data[0].field_0x7;
  uVar3 = *(undefined4 *)&value->m_data[0].m_lo;
  uVar4 = *(undefined4 *)((long)&value->m_data[0].m_lo + 4);
  uVar6 = *(undefined4 *)&value->m_data[0].m_hi;
  uVar7 = *(undefined4 *)((long)&value->m_data[0].m_hi + 4);
  uVar8 = *(undefined4 *)(value->m_data + 1);
  uVar17 = value->m_data[1].field_0x4;
  uVar18 = value->m_data[1].field_0x5;
  uVar19 = value->m_data[1].field_0x6;
  uVar20 = value->m_data[1].field_0x7;
  uVar9 = *(undefined4 *)&value->m_data[1].m_lo;
  uVar10 = *(undefined4 *)((long)&value->m_data[1].m_lo + 4);
  uVar11 = *(undefined4 *)&value->m_data[1].m_hi;
  uVar12 = *(undefined4 *)((long)&value->m_data[1].m_hi + 4);
  *(undefined4 *)pp_Var21 = *(undefined4 *)value->m_data;
  puVar5 = (uchar *)((long)pp_Var21 + 4);
  puVar5[0] = uVar13;
  puVar5[1] = uVar14;
  puVar5[2] = uVar15;
  puVar5[3] = uVar16;
  *(undefined4 *)(pp_Var21 + 1) = uVar3;
  *(undefined4 *)((long)pp_Var21 + 0xc) = uVar4;
  *(undefined4 *)(pp_Var21 + 2) = uVar6;
  *(undefined4 *)((long)pp_Var21 + 0x14) = uVar7;
  *(undefined4 *)(pp_Var21 + 3) = uVar8;
  puVar5 = (uchar *)((long)pp_Var21 + 0x1c);
  puVar5[0] = uVar17;
  puVar5[1] = uVar18;
  puVar5[2] = uVar19;
  puVar5[3] = uVar20;
  *(undefined4 *)(pp_Var21 + 4) = uVar9;
  *(undefined4 *)((long)pp_Var21 + 0x24) = uVar10;
  *(undefined4 *)(pp_Var21 + 5) = uVar11;
  *(undefined4 *)((long)pp_Var21 + 0x2c) = uVar12;
  pcVar2 = (variable->m_name)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + (variable->m_name)._M_string_length);
  local_50.m_state = (SharedPtrStateBase *)0x0;
  local_50.m_ptr = (uchar *)pp_Var21;
  local_50.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_50.m_state)->strongRefCount = 0;
  (local_50.m_state)->weakRefCount = 0;
  (local_50.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02173108;
  local_50.m_state[1]._vptr_SharedPtrStateBase = pp_Var21;
  (local_50.m_state)->strongRefCount = 1;
  (local_50.m_state)->weakRefCount = 1;
  de::
  insert<std::map<std::__cxx11::string,de::SharedPtr<unsigned_char>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,de::SharedPtr<unsigned_char>>>>>
            (&this->m_map,&local_40,&local_50);
  if (local_50.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_50.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_50.m_ptr = (uchar *)0x0;
      (*(local_50.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_50.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_50.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_50.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void						bind	(const Variable<T>&					variable,
										 const typename Traits<T>::IVal&	value)
	{
		deUint8* const data = new deUint8[sizeof(value)];

		deMemcpy(data, &value, sizeof(value));
		de::insert(m_map, variable.getName(), SharedPtr<deUint8>(data, de::ArrayDeleter<deUint8>()));
	}